

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O2

void __thiscall DetectorSS::Update(DetectorSS *this,key_tp src,key_tp dst,val_tp weight)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  DetectorSS *this_00;
  int i;
  long lVar7;
  int iVar8;
  key_tp src_local;
  uint32_t hashval [4];
  undefined1 local_48 [12];
  uint32_t key [3];
  
  local_48._4_4_ = src;
  local_48._0_4_ = dst;
  this_00 = (DetectorSS *)local_48;
  src_local = src;
  uVar4 = MurmurHash64A(this_00,((this->ss_).lgn / 8) * 2,*(this->ss_).hash);
  iVar2 = loghash(this_00,uVar4);
  hashval[0] = 0;
  hashval[1] = 0;
  hashval[2] = 0;
  hashval[3] = 0;
  key[0] = src;
  key[1] = src;
  key[2] = src;
  MurmurHash3_x64_128(key,0xc,(uint32_t)*(this->ss_).hash,hashval);
  iVar3 = (this->ss_).c + -1;
  iVar8 = iVar3;
  if (iVar2 < iVar3) {
    iVar8 = iVar2;
  }
  iVar8 = (int)((long)(&(this->ss_).b)[(ulong)(iVar3 <= iVar2) * 2] * (uVar4 & 0xffffffff) >> 0x20)
          + (this->ss_).offsets[iVar8];
  for (lVar7 = 0; lVar7 < (this->ss_).tdepth; lVar7 = lVar7 + 1) {
    uVar5 = (long)(this->ss_).width * (ulong)hashval[lVar7];
    uVar6 = uVar5 >> 0x20;
    piVar1 = (this->ss_).level[lVar7];
    if (piVar1[uVar6] < iVar2) {
      piVar1[uVar6] = iVar2;
      (this->ss_).skey[lVar7][uVar6] = src;
    }
    Setbit(this,iVar8,(int)(uVar5 >> 0x20),(this->ss_).counts[lVar7]);
  }
  for (lVar7 = 4; lVar7 < (this->ss_).depth; lVar7 = lVar7 + 1) {
    uVar4 = MurmurHash64A(&src_local,(this->ss_).lgn / 8,(this->ss_).hash[lVar7]);
    uVar5 = (long)(this->ss_).width * (uVar4 & 0xffffffff);
    uVar6 = uVar5 >> 0x20;
    piVar1 = (this->ss_).level[lVar7];
    if (piVar1[uVar6] < iVar2) {
      piVar1[uVar6] = iVar2;
      (this->ss_).skey[lVar7][uVar6] = src_local;
    }
    Setbit(this,iVar8,(int)(uVar5 >> 0x20),(this->ss_).counts[lVar7]);
  }
  return;
}

Assistant:

void DetectorSS::Update(key_tp src, key_tp dst, val_tp weight) {
	unsigned long edge = src;
	edge = (edge << 32) | dst;
	int tmplevel = 0;
	//Update sketch
	unsigned long p = MurmurHash64A((unsigned char*)(&edge), ss_.lgn / 8 * 2, ss_.hash[0]);
#ifdef HH
	//check if HH
	int index = p & ss_.mask;
	if (ss_.key[index] == edge) {
		ss_.indicator[index]++;
		return;
	}
	else {
		ss_.indicator[index]--;
		if (ss_.indicator[index] < 0) {
			ss_.key[index] = edge;
			ss_.indicator[index] = 1;
		}
	}
#endif
	tmplevel = loghash(p);
	unsigned bucket = 0;
	uint32_t key[3] = { src, src, src };
	uint32_t hashval[4] = { 0 };
	MurmurHash3_x64_128((unsigned char*)key, 12, ss_.hash[0], (unsigned char*)hashval);
	int pos = 0;
	if (tmplevel < ss_.c - 1) {
		pos = (((uint32_t)p * ((uint64_t)ss_.b)) >> 32);
		pos += ss_.offsets[tmplevel];
	}
	else {
		pos = (((uint32_t)p * (uint64_t)ss_.lastb) >> 32);
		pos += ss_.offsets[ss_.c - 1];
	}

	for (int i = 0; i < ss_.tdepth; i++) {
		bucket = (hashval[i] * (unsigned long)ss_.width) >> 32;
		if (ss_.level[i][bucket] < tmplevel) {
			ss_.level[i][bucket] = tmplevel;
			ss_.skey[i][bucket] = src;
		}
		//Update distinct counter
		Setbit(pos, bucket, ss_.counts[i]);
	}

	for (int i = 4; i < ss_.depth; i++) {
		bucket = MurmurHash64A((unsigned char*)(&src), ss_.lgn / 8, ss_.hash[i]);
		bucket = (bucket * (unsigned long)ss_.width) >> 32;
		if (ss_.level[i][bucket] < tmplevel) {
			ss_.level[i][bucket] = tmplevel;
			ss_.skey[i][bucket] = src;
		}
		Setbit(pos, bucket, ss_.counts[i]);
	}
}